

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O0

void UpdateRootMove(int num_of_all_movements,Movement *all_movements,Movement *move)

{
  bool bVar1;
  Movement *in_RDX;
  long in_RSI;
  int in_EDI;
  int i;
  int local_1c;
  
  for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
    bVar1 = isMoveEqual(in_RDX,(Movement *)(in_RSI + (long)local_1c * 0xc));
    if (bVar1) {
      in_RDX->value = 0x80000000;
    }
    else if (in_RDX->value != 0) {
      in_RDX->value = in_RDX->value - 1;
    }
  }
  return;
}

Assistant:

void UpdateRootMove(int num_of_all_movements, Movement* all_movements, Movement& move){
    for(int i = 0; i < num_of_all_movements; i++){
        if(isMoveEqual(move, all_movements[i])){
            move.value = MAX_MOVE_VALUE;
        }
        else if(move.value){
            move.value--;
        }
    }
}